

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O2

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_ileaveBytes_naive_matches_jmp_::run
          (Test_bitileave_ileaveBytes_naive_matches_jmp_ *this)

{
  SourceLocation loc;
  result_type bytes;
  uint64_t uVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  string_view msg;
  uint64_t naive;
  uint64_t jmp;
  fast_rng64 rng;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  uniform_int_distribution<unsigned_long> distr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_70;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_50;
  
  distr._M_param._M_a = 0;
  distr._M_param._M_b = 0xffffffffffffffff;
  rng._M_x = 0x3039;
  lVar2 = 0x4000;
  uVar3 = 0;
  while( true ) {
    bVar4 = lVar2 == 0;
    lVar2 = lVar2 + -1;
    if (bVar4) {
      return;
    }
    bytes = std::uniform_int_distribution<unsigned_long>::operator()(&distr,&rng);
    uVar1 = detail::ileaveBytes_jmp(bytes,uVar3 % 9);
    jmp = uVar1;
    naive = detail::ileaveBytes_naive(bytes,uVar3 % 9);
    if (uVar1 != naive) break;
    uVar3 = uVar3 + 1;
  }
  stringify<unsigned_long>(&local_50,&jmp);
  std::operator+(&local_d0,"Comparison failed: jmp == naive (with \"jmp\"=",&local_50);
  std::operator+(&local_b0,&local_d0,", \"naive\"=");
  stringify<unsigned_long>(&local_70,&naive);
  std::operator+(&local_90,&local_b0,&local_70);
  std::operator+(&local_100,&local_90,")");
  loc.function = "run";
  loc.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  loc.line = 0xd4;
  msg._M_str = local_100._M_dataplus._M_p;
  msg._M_len = local_100._M_string_length;
  assertFail(msg,loc);
}

Assistant:

BITMANIP_TEST(bitileave, ileaveBytes_naive_matches_jmp)
{
    constexpr size_t iterations = 1024 * 16;

    fast_rng64 rng{12345};
    std::uniform_int_distribution<std::uint64_t> distr;

    for (size_t i = 0; i < iterations; ++i) {
        std::uint64_t bytesAsInt = distr(rng);

        std::uint64_t jmp = detail::ileaveBytes_jmp(bytesAsInt, i % 9);
        std::uint64_t naive = detail::ileaveBytes_naive(bytesAsInt, i % 9);
        BITMANIP_ASSERT_EQ(jmp, naive);
    }
}